

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_slay(void)

{
  int local_c;
  wchar_t idx;
  
  for (local_c = 0; local_c < (int)(uint)z_info->slay_max; local_c = local_c + 1) {
    string_free(slays[local_c].code);
    string_free(slays[local_c].name);
    string_free(slays[local_c].base);
    string_free(slays[local_c].melee_verb);
    string_free(slays[local_c].range_verb);
  }
  mem_free(slays);
  return;
}

Assistant:

static void cleanup_slay(void)
{
	int idx;
	for (idx = 0; idx < z_info->slay_max; idx++) {
		string_free(slays[idx].code);
		string_free(slays[idx].name);
		string_free(slays[idx].base);
		string_free(slays[idx].melee_verb);
		string_free(slays[idx].range_verb);
	}
	mem_free(slays);
}